

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_optimizer.hpp
# Opt level: O3

unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
 __thiscall
chaiscript::optimizer::Constant_Fold::
optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
          (Constant_Fold *this,
          AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node)

{
  size_type sVar1;
  long *plVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  long lVar4;
  double val_00;
  bool bVar5;
  bool bVar6;
  Opers OVar7;
  int iVar8;
  long *plVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  float val_01;
  string_view t_str;
  string_view t_str_00;
  Boxed_Value val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> match;
  Boxed_Value rhs;
  Boxed_Value lhs;
  Boxed_Value lhs_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Boxed_Value val_1;
  undefined1 local_138 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Boxed_Value local_f0;
  Boxed_Value local_e0;
  undefined1 local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Boxed_Value local_90;
  Boxed_Value local_80;
  Boxed_Value local_70;
  Boxed_Value local_60;
  Boxed_Value local_50;
  Boxed_Number local_40;
  
  sVar1 = in_RDX->_M_allocated_capacity;
  iVar8 = *(int *)(sVar1 + 8);
  if (iVar8 < 0x20) {
    if (iVar8 == 1) {
      plVar9 = *(long **)(sVar1 + 0x50);
      if ((((*(long *)(sVar1 + 0x58) - (long)plVar9 != 0x10) || (*(int *)(*plVar9 + 8) != 0)) ||
          (lVar4 = plVar9[1], *(int *)(lVar4 + 8) != 3)) ||
         ((*(long *)(lVar4 + 0x58) - (long)*(long **)(lVar4 + 0x50) != 8 ||
          (plVar9 = (long *)**(long **)(lVar4 + 0x50), (int)plVar9[1] != 0x2b)))) goto LAB_0032a286;
      if ((undefined **)*plVar9 != &PTR_get_children_003d30c8) {
        __cxa_bad_cast();
      }
      peVar3 = (element_type *)plVar9[0xd];
      this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[0xe];
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        }
      }
      bVar6 = true;
      if (((peVar3->m_type_info).m_flags & 0x10) != 0) {
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (**(long **)(in_RDX->_M_allocated_capacity + 0x50) + 0x10);
        local_110._M_dataplus._M_p = (pointer)in_RDX;
        local_110._M_string_length = (size_type)pbVar10;
        iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(pbVar10,"double");
        if (iVar8 == 0) {
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            }
          }
          local_50.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar3;
          local_50.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = this_00._M_pi;
          Boxed_Number::Boxed_Number((Boxed_Number *)local_138,&local_50);
          val_00 = Boxed_Number::get_as<double>((Boxed_Number *)local_138);
          optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
          ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)this,val_00);
          this_01._M_pi =
               local_50.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            this_01._M_pi =
                 local_50.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
        }
        else {
          iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(pbVar10,"int");
          if (iVar8 == 0) {
            if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              }
            }
            local_60.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar3;
            local_60.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = this_00._M_pi;
            Boxed_Number::Boxed_Number((Boxed_Number *)local_138,&local_60);
            Boxed_Number::get_as<int>((Boxed_Number *)local_138);
            optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
            ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)this,(int)&local_110);
            this_01._M_pi =
                 local_60.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
              this_01._M_pi =
                   local_60.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
          }
          else {
            iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(pbVar10,"float");
            if (iVar8 == 0) {
              if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                }
              }
              local_70.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   peVar3;
              local_70.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = this_00._M_pi;
              Boxed_Number::Boxed_Number((Boxed_Number *)local_138,&local_70);
              val_01 = Boxed_Number::get_as<float>((Boxed_Number *)local_138);
              optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
              ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)this,val_01);
              this_01._M_pi =
                   local_70.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
                this_01._M_pi =
                     local_70.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
            }
            else {
              iVar8 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (pbVar10,"long");
              if (iVar8 == 0) {
                if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                  }
                }
                local_80.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = peVar3;
                local_80.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = this_00._M_pi;
                Boxed_Number::Boxed_Number((Boxed_Number *)local_138,&local_80);
                Boxed_Number::get_as<long>((Boxed_Number *)local_138);
                optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
                ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)this,(long)&local_110);
                this_01._M_pi =
                     local_80.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
                  this_01._M_pi =
                       local_80.m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
                }
              }
              else {
                iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (pbVar10,"size_t");
                if (iVar8 != 0) goto joined_r0x0032a7eb;
                if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                  }
                }
                local_90.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = peVar3;
                local_90.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = this_00._M_pi;
                Boxed_Number::Boxed_Number((Boxed_Number *)local_138,&local_90);
                Boxed_Number::get_as<unsigned_long>((Boxed_Number *)local_138);
                optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
                ::{lambda(auto:1)#1}::operator()
                          ((_lambda_auto_1__1_ *)this,(unsigned_long)&local_110);
                this_01._M_pi =
                     local_90.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
                  this_01._M_pi =
                       local_90.m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
                }
              }
            }
          }
        }
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
        bVar6 = false;
      }
    }
    else {
      if (((iVar8 != 0x15) || (*(long *)(sVar1 + 0x58) - (long)*(long **)(sVar1 + 0x50) != 8)) ||
         (*(int *)(**(long **)(sVar1 + 0x50) + 8) != 0x2b)) goto LAB_0032a286;
      t_str._M_str = (char *)0x1;
      t_str._M_len = *(size_t *)(sVar1 + 0x10);
      OVar7 = Operators::to_operator(*(Operators **)(sVar1 + 0x18),t_str,true);
      plVar9 = *(long **)(in_RDX->_M_allocated_capacity + 0x50);
      local_d0._0_8_ = *(undefined8 *)(*plVar9 + 0x68);
      local_d0._8_8_ = *(long *)(*plVar9 + 0x70);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_)->_M_use_count + 1;
          UNLOCK();
          plVar9 = *(long **)(in_RDX->_M_allocated_capacity + 0x50);
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_)->_M_use_count + 1;
        }
      }
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (sVar1 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*plVar9 + 0x10));
      if (((OVar7 == bitwise_and) || (OVar7 == invalid)) ||
         ((*(uint *)(local_d0._0_8_ + 0x10) & 0x10) == 0)) {
        bVar5 = Type_Info::bare_equal_type_info
                          ((Type_Info *)local_d0._0_8_,(type_info *)&bool::typeinfo);
        bVar6 = true;
        if ((bVar5) &&
           (iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (sVar1 + 0x10),"!"), iVar8 == 0)) {
          sVar1 = in_RDX->_M_allocated_capacity;
          bVar6 = boxed_cast<bool>((Boxed_Value *)local_d0,(Type_Conversions_State *)0x0);
          Boxed_Value::Object_Data::get<bool>((Object_Data *)local_138,!bVar6,false);
          make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::__cxx11::string_const,chaiscript::Parse_Location&,chaiscript::Boxed_Value>
                    ((chaiscript *)this,&local_110,(Parse_Location *)(sVar1 + 0x30),
                     (Boxed_Value *)local_138);
          local_b0._M_string_length = local_138._8_8_;
          goto LAB_0032a08c;
        }
      }
      else {
        local_138._0_4_ = OVar7;
        local_138._8_8_ = local_d0;
        Boxed_Number::
        visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
                  ((Boxed_Number *)&local_b0,(Boxed_Value *)local_138._8_8_,
                   (anon_class_16_2_73f5579e *)local_138);
        make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::__cxx11::string_const,chaiscript::Parse_Location&,chaiscript::Boxed_Value_const>
                  ((chaiscript *)this,&local_110,
                   (Parse_Location *)(in_RDX->_M_allocated_capacity + 0x30),(Boxed_Value *)&local_b0
                  );
LAB_0032a08c:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length);
        }
        bVar6 = false;
      }
      this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_;
      }
    }
  }
  else {
    if (1 < iVar8 - 0x20U) {
      if (((iVar8 == 0x28) &&
          (plVar9 = *(long **)(sVar1 + 0x50), *(long *)(sVar1 + 0x58) - (long)plVar9 == 0x10)) &&
         ((*(int *)(*plVar9 + 8) == 0x2b &&
          ((*(int *)(plVar9[1] + 8) == 0x2b &&
           (t_str_00._M_str = (char *)0x0, t_str_00._M_len = *(ulong *)(sVar1 + 0x10),
           OVar7 = Operators::to_operator(*(Operators **)(sVar1 + 0x18),t_str_00,SUB81(*plVar9,0)),
           OVar7 != invalid)))))) {
        plVar9 = *(long **)(in_RDX->_M_allocated_capacity + 0x50);
        plVar2 = (long *)*plVar9;
        if ((undefined **)*plVar2 != &PTR_get_children_003d30c8) {
          __cxa_bad_cast();
        }
        local_e0.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)plVar2[0xd];
        local_e0.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[0xe];
        if (local_e0.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_e0.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_e0.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
            plVar9 = *(long **)(in_RDX->_M_allocated_capacity + 0x50);
          }
          else {
            (local_e0.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_e0.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        plVar9 = (long *)plVar9[1];
        if ((undefined **)*plVar9 != &PTR_get_children_003d30c8) {
          __cxa_bad_cast();
        }
        local_f0.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)plVar9[0xd];
        local_f0.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[0xe];
        if (local_f0.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_f0.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_f0.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_f0.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_f0.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        if (((((local_e0.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->m_type_info).m_flags & 0x10) != 0) &&
           ((((local_f0.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_type_info).m_flags & 0x10) != 0)) {
          local_110._M_dataplus._M_p._0_4_ = OVar7;
          local_110._M_string_length = (size_type)&local_e0;
          local_110.field_2._M_allocated_capacity = (size_type)&local_f0;
          Boxed_Number::
          visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
                    (&local_40,(Boxed_Value *)local_110._M_string_length,
                     (anon_class_24_3_1b4046b4 *)&local_110);
          std::operator+(&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (**(long **)(in_RDX->_M_allocated_capacity + 0x50) + 0x10)," ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0,&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (sVar1 + 0x10));
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d0," ");
          local_138._0_8_ = (pbVar10->_M_dataplus)._M_p;
          paVar11 = &pbVar10->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._0_8_ == paVar11) {
            local_138._16_8_ = paVar11->_M_allocated_capacity;
            local_138._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            local_138._0_8_ = (element_type *)(local_138 + 0x10);
          }
          else {
            local_138._16_8_ = paVar11->_M_allocated_capacity;
          }
          local_138._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          std::operator+(&local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(*(long *)(in_RDX->_M_allocated_capacity + 0x50) + 8) + 0x10));
          if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          }
          if ((element_type *)local_d0._0_8_ != (element_type *)(local_d0 + 0x10)) {
            operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::__cxx11::string_const,chaiscript::Parse_Location&,chaiscript::Boxed_Value_const>
                    ((chaiscript *)this,&local_110,
                     (Parse_Location *)(in_RDX->_M_allocated_capacity + 0x30),&local_40.bv);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,
                            (ulong)(local_110.field_2._M_allocated_capacity + 1));
          }
          if (local_40.bv.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.bv.m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_f0.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f0.m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_e0.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
                    )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
                      )this;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
                  )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
                    )this;
        }
        if (local_f0.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f0.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_e0.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      goto LAB_0032a286;
    }
    plVar9 = *(long **)(sVar1 + 0x50);
    if (((*(long *)(sVar1 + 0x58) - (long)plVar9 != 0x10) ||
        (plVar2 = (long *)*plVar9, (int)plVar2[1] != 0x2b)) ||
       (plVar9 = (long *)plVar9[1], (int)plVar9[1] != 0x2b)) goto LAB_0032a286;
    if ((undefined **)*plVar2 != &PTR_get_children_003d30c8) {
      __cxa_bad_cast();
    }
    local_e0.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)plVar2[0xd];
    local_e0.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[0xe];
    if (local_e0.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e0.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e0.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        plVar9 = *(long **)(*(long *)(in_RDX->_M_allocated_capacity + 0x50) + 8);
      }
      else {
        (local_e0.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e0.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    if ((undefined **)*plVar9 != &PTR_get_children_003d30c8) {
      __cxa_bad_cast();
    }
    local_f0.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)plVar9[0xd];
    local_f0.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[0xe];
    if (local_f0.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f0.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_f0.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f0.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_f0.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar5 = Type_Info::bare_equal_type_info
                      ((Type_Info *)
                       local_e0.m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(type_info *)&bool::typeinfo);
    bVar6 = true;
    if ((bVar5) &&
       (bVar5 = Type_Info::bare_equal_type_info
                          (&(local_f0.m_data.
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_type_info,(type_info *)&bool::typeinfo), bVar5)) {
      lVar4 = *(long *)(**(long **)(in_RDX->_M_allocated_capacity + 0x50) + 0x10);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,lVar4,
                 *(long *)(**(long **)(in_RDX->_M_allocated_capacity + 0x50) + 0x18) + lVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_b0," ");
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_b0,*(char **)(in_RDX->_M_allocated_capacity + 0x10),
                          *(size_type *)(in_RDX->_M_allocated_capacity + 0x18));
      local_d0._0_8_ = (pbVar10->_M_dataplus)._M_p;
      paVar11 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._0_8_ == paVar11) {
        local_d0._16_8_ = paVar11->_M_allocated_capacity;
        local_d0._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_d0._0_8_ = (element_type *)(local_d0 + 0x10);
      }
      else {
        local_d0._16_8_ = paVar11->_M_allocated_capacity;
      }
      local_d0._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ," ");
      local_138._0_8_ = (pbVar10->_M_dataplus)._M_p;
      paVar11 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._0_8_ == paVar11) {
        local_138._16_8_ = paVar11->_M_allocated_capacity;
        local_138._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_138._0_8_ = (element_type *)(local_138 + 0x10);
      }
      else {
        local_138._16_8_ = paVar11->_M_allocated_capacity;
      }
      local_138._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      lVar4 = *(long *)(*(long *)(in_RDX->_M_allocated_capacity + 0x50) + 8);
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_138,*(char **)(lVar4 + 0x10),*(size_type *)(lVar4 + 0x18));
      local_110._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      paVar11 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == paVar11) {
        local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_110._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if ((element_type *)local_d0._0_8_ != (element_type *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      bVar6 = boxed_cast<bool>(&local_e0,(Type_Conversions_State *)0x0);
      bVar5 = boxed_cast<bool>(&local_f0,(Type_Conversions_State *)0x0);
      if (*(int *)(in_RDX->_M_allocated_capacity + 8) == 0x20) {
        bVar6 = bVar6 && bVar5;
      }
      else {
        bVar6 = bVar6 || bVar5;
      }
      Boxed_Value::Object_Data::get<bool>((Object_Data *)local_138,bVar6,false);
      make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::__cxx11::string_const,chaiscript::Parse_Location&,chaiscript::Boxed_Value_const>
                ((chaiscript *)this,&local_110,
                 (Parse_Location *)(in_RDX->_M_allocated_capacity + 0x30),(Boxed_Value *)local_138);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      bVar6 = false;
    }
    this_00._M_pi =
         local_e0.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_f0.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      this_00._M_pi =
           local_e0.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    }
  }
joined_r0x0032a7eb:
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (!bVar6) {
    return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
            )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
              )this;
  }
LAB_0032a286:
  *(size_type *)this = in_RDX->_M_allocated_capacity;
  in_RDX->_M_allocated_capacity = 0;
  return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
          )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
            )this;
}

Assistant:

auto optimize(eval::AST_Node_Impl_Ptr<T> node) {
        if (node->identifier == AST_Node_Type::Prefix && node->children.size() == 1 && node->children[0]->identifier == AST_Node_Type::Constant) {
          try {
            const auto &oper = node->text;
            const auto parsed = Operators::to_operator(oper, true);
            const auto lhs = dynamic_cast<const eval::Constant_AST_Node<T> *>(node->children[0].get())->m_value;
            const auto match = oper + node->children[0]->text;

            if (parsed != Operators::Opers::invalid && parsed != Operators::Opers::bitwise_and && lhs.get_type_info().is_arithmetic()) {
              const auto val = Boxed_Number::do_oper(parsed, lhs);
              return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                 node->location,
                                                                                                 std::move(val));
            } else if (lhs.get_type_info().bare_equal_type_info(typeid(bool)) && oper == "!") {
              return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                 node->location,
                                                                                                 Boxed_Value(!boxed_cast<bool>(lhs)));
            }
          } catch (const std::exception &) {
            // failure to fold, that's OK
          }
        } else if ((node->identifier == AST_Node_Type::Logical_And || node->identifier == AST_Node_Type::Logical_Or)
                   && node->children.size() == 2 && node->children[0]->identifier == AST_Node_Type::Constant
                   && node->children[1]->identifier == AST_Node_Type::Constant) {
          try {
            const auto lhs = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[0]).m_value;
            const auto rhs = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[1]).m_value;
            if (lhs.get_type_info().bare_equal_type_info(typeid(bool)) && rhs.get_type_info().bare_equal_type_info(typeid(bool))) {
              const auto match = node->children[0]->text + " " + node->text + " " + node->children[1]->text;
              const auto val = [lhs_val = boxed_cast<bool>(lhs), rhs_val = boxed_cast<bool>(rhs), id = node->identifier] {
                if (id == AST_Node_Type::Logical_And) {
                  return Boxed_Value(lhs_val && rhs_val);
                } else {
                  return Boxed_Value(lhs_val || rhs_val);
                }
              }();

              return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                 node->location,
                                                                                                 std::move(val));
            }
          } catch (const std::exception &) {
            // failure to fold, that's OK
          }
        } else if (node->identifier == AST_Node_Type::Binary && node->children.size() == 2
                   && node->children[0]->identifier == AST_Node_Type::Constant && node->children[1]->identifier == AST_Node_Type::Constant) {
          try {
            const auto &oper = node->text;
            const auto parsed = Operators::to_operator(oper);
            if (parsed != Operators::Opers::invalid) {
              const auto lhs = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[0]).m_value;
              const auto rhs = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[1]).m_value;
              if (lhs.get_type_info().is_arithmetic() && rhs.get_type_info().is_arithmetic()) {
                const auto val = Boxed_Number::do_oper(parsed, lhs, rhs);
                const auto match = node->children[0]->text + " " + oper + " " + node->children[1]->text;
                return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                   node->location,
                                                                                                   std::move(val));
              }
            }
          } catch (const std::exception &) {
            // failure to fold, that's OK
          }
        } else if (node->identifier == AST_Node_Type::Fun_Call && node->children.size() == 2
                   && node->children[0]->identifier == AST_Node_Type::Id && node->children[1]->identifier == AST_Node_Type::Arg_List
                   && node->children[1]->children.size() == 1 && node->children[1]->children[0]->identifier == AST_Node_Type::Constant) {
          const auto arg = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[1]->children[0]).m_value;
          if (arg.get_type_info().is_arithmetic()) {
            const auto &fun_name = node->children[0]->text;

            const auto make_constant = [&node, &fun_name](auto val) {
              const auto match = fun_name + "(" + node->children[1]->children[0]->text + ")";
              return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                 node->location,
                                                                                                 const_var(val));
            };

            if (fun_name == "double") {
              return make_constant(Boxed_Number(arg).get_as<double>());
            } else if (fun_name == "int") {
              return make_constant(Boxed_Number(arg).get_as<int>());
            } else if (fun_name == "float") {
              return make_constant(Boxed_Number(arg).get_as<float>());
            } else if (fun_name == "long") {
              return make_constant(Boxed_Number(arg).get_as<long>());
            } else if (fun_name == "size_t") {
              return make_constant(Boxed_Number(arg).get_as<size_t>());
            }
          }
        }

        return node;
      }